

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O1

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::flipAndUpdate(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int *nflips)

{
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  bool bVar1;
  bool bVar2;
  int iVar3;
  Status SVar4;
  uint uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar9;
  undefined8 uVar10;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar11;
  undefined4 uVar16;
  undefined4 uVar17;
  pointer pBVar12;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar13;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar14;
  int *piVar15;
  char cVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  pointer pnVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  long lVar24;
  long lVar25;
  Status *pSVar26;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar27;
  long lVar28;
  int32_t iVar29;
  SPxOut *pSVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  pointer pnVar35;
  uint *puVar36;
  pointer pnVar37;
  cpp_dec_float<200U,_int,_void> *pcVar38;
  uint *puVar39;
  pointer pnVar40;
  cpp_dec_float<200U,_int,_void> *pcVar41;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar42;
  undefined1 uVar43;
  fpclass_type fVar44;
  int32_t iVar45;
  undefined1 uVar46;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar47;
  fpclass_type fVar48;
  long in_FS_OFFSET;
  byte bVar49;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  SPxId baseId;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lower;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upper;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  int local_f94;
  cpp_dec_float<200U,_int,_void> local_f88;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f08;
  long local_f00;
  undefined4 local_ef4;
  DataKey local_ef0;
  cpp_dec_float<200U,_int,_void> local_ee8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_e60;
  cpp_dec_float<200U,_int,_void> local_e58;
  cpp_dec_float<200U,_int,_void> local_dd8;
  cpp_dec_float<200U,_int,_void> local_d58;
  undefined4 local_cd8;
  uint uStack_cd4;
  undefined4 uStack_cd0;
  undefined4 uStack_ccc;
  double local_cc8;
  undefined8 uStack_cc0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_cb8;
  int *local_cb0;
  long local_ca8;
  cpp_dec_float<200U,_int,_void> local_ca0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ba0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_aa0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_920;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_820;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_720;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_620;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_520;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_420;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_320;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_220;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_120;
  uint local_a0 [28];
  
  bVar49 = 0;
  this_00 = &this->updPrimRhs;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(this_00);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(this_00,(((this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver)->thecovectors->set).thenum);
  this_01 = &this->updPrimVec;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(this_01,(((this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver)->thecovectors->set).thenum);
  local_e60 = this_00;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(this_00);
  local_cb8 = this_01;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(this_01);
  iVar21 = *nflips;
  if (iVar21 < 1) {
    local_f94 = 0;
  }
  else {
    local_cc8 = *(double *)(in_FS_OFFSET + -8);
    local_cd8 = SUB84(local_cc8,0);
    uStack_cc0 = 0;
    uStack_cd4 = (uint)((ulong)local_cc8 >> 0x20) ^ 0x80000000;
    uStack_cd0 = 0;
    uStack_ccc = 0x80000000;
    lVar24 = 0;
    lVar28 = 0;
    local_f94 = 0;
    local_f08 = this;
    local_cb0 = nflips;
    do {
      iVar21 = *(int *)((long)(&((this->breakpoints).data.
                                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->val + 1) + lVar24);
      lVar34 = (long)iVar21;
      if (lVar34 < 0) {
        local_f94 = local_f94 + 1;
      }
      else {
        local_ee8.fpclass = cpp_dec_float_finite;
        local_ee8.prec_elem = 0x1c;
        local_ee8.data._M_elems[0] = 0;
        local_ee8.data._M_elems[1] = 0;
        local_ee8.data._M_elems[2] = 0;
        local_ee8.data._M_elems[3] = 0;
        local_ee8.data._M_elems[4] = 0;
        local_ee8.data._M_elems[5] = 0;
        local_ee8.data._M_elems[6] = 0;
        local_ee8.data._M_elems[7] = 0;
        local_ee8.data._M_elems[8] = 0;
        local_ee8.data._M_elems[9] = 0;
        local_ee8.data._M_elems[10] = 0;
        local_ee8.data._M_elems[0xb] = 0;
        local_ee8.data._M_elems[0xc] = 0;
        local_ee8.data._M_elems[0xd] = 0;
        local_ee8.data._M_elems[0xe] = 0;
        local_ee8.data._M_elems[0xf] = 0;
        local_ee8.data._M_elems[0x10] = 0;
        local_ee8.data._M_elems[0x11] = 0;
        local_ee8.data._M_elems[0x12] = 0;
        local_ee8.data._M_elems[0x13] = 0;
        local_ee8.data._M_elems[0x14] = 0;
        local_ee8.data._M_elems[0x15] = 0;
        local_ee8.data._M_elems[0x16] = 0;
        local_ee8.data._M_elems[0x17] = 0;
        local_ee8.data._M_elems[0x18] = 0;
        local_ee8.data._M_elems[0x19] = 0;
        local_ee8.data._M_elems._104_5_ = 0;
        local_ee8.data._M_elems[0x1b]._1_3_ = 0;
        local_ee8.exp = 0;
        local_ee8.neg = false;
        local_dd8.fpclass = cpp_dec_float_finite;
        local_dd8.prec_elem = 0x1c;
        local_dd8.data._M_elems[0] = 0;
        local_dd8.data._M_elems[1] = 0;
        local_dd8.data._M_elems[2] = 0;
        local_dd8.data._M_elems[3] = 0;
        local_dd8.data._M_elems[4] = 0;
        local_dd8.data._M_elems[5] = 0;
        local_dd8.data._M_elems[6] = 0;
        local_dd8.data._M_elems[7] = 0;
        local_dd8.data._M_elems[8] = 0;
        local_dd8.data._M_elems[9] = 0;
        local_dd8.data._M_elems[10] = 0;
        local_dd8.data._M_elems[0xb] = 0;
        local_dd8.data._M_elems[0xc] = 0;
        local_dd8.data._M_elems[0xd] = 0;
        local_dd8.data._M_elems[0xe] = 0;
        local_dd8.data._M_elems[0xf] = 0;
        local_dd8.data._M_elems[0x10] = 0;
        local_dd8.data._M_elems[0x11] = 0;
        local_dd8.data._M_elems[0x12] = 0;
        local_dd8.data._M_elems[0x13] = 0;
        local_dd8.data._M_elems[0x14] = 0;
        local_dd8.data._M_elems[0x15] = 0;
        local_dd8.data._M_elems[0x16] = 0;
        local_dd8.data._M_elems[0x17] = 0;
        local_dd8.data._M_elems[0x18] = 0;
        local_dd8.data._M_elems[0x19] = 0;
        local_dd8.data._M_elems._104_5_ = 0;
        local_dd8.data._M_elems[0x1b]._1_3_ = 0;
        local_dd8.exp = 0;
        local_dd8.neg = false;
        local_e58.fpclass = cpp_dec_float_finite;
        local_e58.prec_elem = 0x1c;
        local_e58.data._M_elems[0] = 0;
        local_e58.data._M_elems[1] = 0;
        local_e58.data._M_elems[2] = 0;
        local_e58.data._M_elems[3] = 0;
        local_e58.data._M_elems[4] = 0;
        local_e58.data._M_elems[5] = 0;
        local_e58.data._M_elems[6] = 0;
        local_e58.data._M_elems[7] = 0;
        local_e58.data._M_elems[8] = 0;
        local_e58.data._M_elems[9] = 0;
        local_e58.data._M_elems[10] = 0;
        local_e58.data._M_elems[0xb] = 0;
        local_e58.data._M_elems[0xc] = 0;
        local_e58.data._M_elems[0xd] = 0;
        local_e58.data._M_elems[0xe] = 0;
        local_e58.data._M_elems[0xf] = 0;
        local_e58.data._M_elems[0x10] = 0;
        local_e58.data._M_elems[0x11] = 0;
        local_e58.data._M_elems[0x12] = 0;
        local_e58.data._M_elems[0x13] = 0;
        local_e58.data._M_elems[0x14] = 0;
        local_e58.data._M_elems[0x15] = 0;
        local_e58.data._M_elems[0x16] = 0;
        local_e58.data._M_elems[0x17] = 0;
        local_e58.data._M_elems[0x18] = 0;
        local_e58.data._M_elems[0x19] = 0;
        local_e58.data._M_elems._104_5_ = 0;
        local_e58.data._M_elems[0x1b]._1_3_ = 0;
        local_e58.exp = 0;
        local_e58.neg = false;
        local_d58.fpclass = cpp_dec_float_finite;
        local_d58.prec_elem = 0x1c;
        local_d58.data._M_elems[0] = 0;
        local_d58.data._M_elems[1] = 0;
        local_d58.data._M_elems[2] = 0;
        local_d58.data._M_elems[3] = 0;
        local_d58.data._M_elems[4] = 0;
        local_d58.data._M_elems[5] = 0;
        local_d58.data._M_elems[6] = 0;
        local_d58.data._M_elems[7] = 0;
        local_d58.data._M_elems[8] = 0;
        local_d58.data._M_elems[9] = 0;
        local_d58.data._M_elems[10] = 0;
        local_d58.data._M_elems[0xb] = 0;
        local_d58.data._M_elems[0xc] = 0;
        local_d58.data._M_elems[0xd] = 0;
        local_d58.data._M_elems[0xe] = 0;
        local_d58.data._M_elems[0xf] = 0;
        local_d58.data._M_elems[0x10] = 0;
        local_d58.data._M_elems[0x11] = 0;
        local_d58.data._M_elems[0x12] = 0;
        local_d58.data._M_elems[0x13] = 0;
        local_d58.data._M_elems[0x14] = 0;
        local_d58.data._M_elems[0x15] = 0;
        local_d58.data._M_elems[0x16] = 0;
        local_d58.data._M_elems[0x17] = 0;
        local_d58.data._M_elems[0x18] = 0;
        local_d58.data._M_elems[0x19] = 0;
        local_d58.data._M_elems._104_5_ = 0;
        local_d58.data._M_elems[0x1b]._1_3_ = 0;
        local_d58.exp = 0;
        local_d58.neg = false;
        local_f00 = lVar24;
        local_ca8 = lVar28;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_d58,0.0);
        pSVar8 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&local_ee8,0);
        pSVar47 = local_f08;
        iVar3 = *(int *)((long)&((this->breakpoints).data.
                                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->src + local_f00);
        if (iVar3 == -1) {
          pSVar11 = (this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .thesolver;
          local_ef0 = (pSVar11->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).theBaseId.data[lVar34].super_DataKey;
          iVar3 = local_f94;
          if (local_ef0.info < 0) {
            SPxRowId::SPxRowId((SPxRowId *)&local_f88,(SPxId *)&local_ef0);
            iVar20 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar11->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)&local_f88);
            pSVar47 = local_f08;
            pSVar26 = (pSVar8->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.rowstat.data;
            lVar24 = (long)iVar20;
            SVar4 = pSVar26[lVar24];
            pSVar8 = (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver;
            pnVar22 = (pSVar8->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar37 = pnVar22 + lVar24;
            pcVar38 = &local_dd8;
            for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
              (pcVar38->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
              pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
            }
            iVar20 = pnVar22[lVar24].m_backend.exp;
            local_dd8.exp = iVar20;
            uVar43 = pnVar22[lVar24].m_backend.neg;
            local_dd8.neg = (bool)uVar43;
            fVar44 = pnVar22[lVar24].m_backend.fpclass;
            iVar29 = pnVar22[lVar24].m_backend.prec_elem;
            local_dd8.prec_elem = iVar29;
            local_dd8.fpclass = fVar44;
            pnVar22 = (pSVar8->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar37 = pnVar22 + lVar24;
            pcVar38 = &local_e58;
            for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
              (pcVar38->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
              pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
            }
            iVar31 = pnVar22[lVar24].m_backend.exp;
            local_e58.exp = iVar31;
            uVar46 = pnVar22[lVar24].m_backend.neg;
            local_e58.neg = (bool)uVar46;
            fVar48 = pnVar22[lVar24].m_backend.fpclass;
            iVar45 = pnVar22[lVar24].m_backend.prec_elem;
            local_e58.prec_elem = iVar45;
            local_e58.fpclass = fVar48;
            if (SVar4 == P_ON_LOWER) goto LAB_005d711d;
            if (SVar4 == P_ON_UPPER) goto LAB_005d6d3a;
            pSVar30 = pSVar8->spxout;
            iVar3 = local_f94 + 1;
            if ((pSVar30 != (SPxOut *)0x0) && (0 < (int)pSVar30->m_verbosity)) {
              local_f88.data._M_elems[0] = pSVar30->m_verbosity;
              local_ef4 = 1;
              (*pSVar30->_vptr_SPxOut[2])(pSVar30,&local_ef4);
              pSVar30 = ((pSVar47->
                         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver)->spxout;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity],"unexpected basis status: ",0x19);
              std::ostream::operator<<((ostream *)pSVar30->m_streams[pSVar30->m_verbosity],SVar4);
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," index: ",8);
              std::ostream::operator<<((ostream *)pSVar30->m_streams[pSVar30->m_verbosity],iVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," val: ",6);
              pnVar22 = (((pSVar47->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->theFvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar37 = pnVar22 + lVar34;
              pnVar27 = &local_7a0;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = *(uint *)&pnVar37->m_backend;
                pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_7a0.m_backend.exp = pnVar22[lVar34].m_backend.exp;
              local_7a0.m_backend.neg = pnVar22[lVar34].m_backend.neg;
              local_7a0.m_backend.fpclass = pnVar22[lVar34].m_backend.fpclass;
              local_7a0.m_backend.prec_elem = pnVar22[lVar34].m_backend.prec_elem;
              boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],&local_7a0)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," upd: ",6);
              pnVar22 = (((pSVar47->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->theFvec->thedelta).
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar37 = pnVar22 + lVar34;
              pnVar27 = &local_820;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
                pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_820.m_backend.exp = pnVar22[lVar34].m_backend.exp;
              local_820.m_backend.neg = pnVar22[lVar34].m_backend.neg;
              local_820.m_backend.fpclass = pnVar22[lVar34].m_backend.fpclass;
              local_820.m_backend.prec_elem = pnVar22[lVar34].m_backend.prec_elem;
              boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],&local_820)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," lower: ",8);
              pcVar38 = &local_e58;
              pnVar27 = &local_8a0;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar38 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_8a0.m_backend.exp = local_e58.exp;
              local_8a0.m_backend.neg = local_e58.neg;
              local_8a0.m_backend.fpclass = local_e58.fpclass;
              local_8a0.m_backend.prec_elem = local_e58.prec_elem;
              boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],&local_8a0)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," upper: ",8);
              pcVar38 = &local_dd8;
              pnVar27 = &local_920;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar38 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_920.m_backend.exp = local_dd8.exp;
              local_920.m_backend.neg = local_dd8.neg;
              local_920.m_backend.fpclass = local_dd8.fpclass;
              local_920.m_backend.prec_elem = local_dd8.prec_elem;
              boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],&local_920)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," bp.val: ",9);
              pBVar12 = (pSVar47->breakpoints).data.
                        super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar27 = &local_9a0;
              puVar39 = (uint *)((long)(pBVar12->val).m_backend.data._M_elems + local_f00);
              pnVar42 = pnVar27;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar42->m_backend).data._M_elems[0] = *puVar39;
                puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
                pnVar42 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar42 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_9a0.m_backend.exp =
                   *(int *)((long)(&(pBVar12->val).m_backend.data + 1) + local_f00);
              local_9a0.m_backend.neg =
                   *(bool *)((long)(&(pBVar12->val).m_backend.data + 1) + local_f00 + 4U);
              local_9a0.m_backend._120_8_ =
                   *(undefined8 *)((long)(&(pBVar12->val).m_backend.data + 1) + local_f00 + 8U);
              goto LAB_005d80c1;
            }
          }
          else {
            SPxColId::SPxColId((SPxColId *)&local_f88,(SPxId *)&local_ef0);
            iVar20 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar11->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)&local_f88);
            pSVar47 = local_f08;
            pSVar26 = (pSVar8->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.colstat.data;
            lVar24 = (long)iVar20;
            SVar4 = pSVar26[lVar24];
            pSVar8 = (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver;
            pnVar22 = (pSVar8->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar37 = pnVar22 + lVar24;
            pcVar38 = &local_dd8;
            for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
              (pcVar38->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
              pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
            }
            iVar20 = pnVar22[lVar24].m_backend.exp;
            local_dd8.exp = iVar20;
            uVar43 = pnVar22[lVar24].m_backend.neg;
            local_dd8.neg = (bool)uVar43;
            fVar44 = pnVar22[lVar24].m_backend.fpclass;
            iVar29 = pnVar22[lVar24].m_backend.prec_elem;
            local_dd8.prec_elem = iVar29;
            local_dd8.fpclass = fVar44;
            pnVar22 = (pSVar8->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar37 = pnVar22 + lVar24;
            pcVar38 = &local_e58;
            for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
              (pcVar38->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
              pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
            }
            iVar31 = pnVar22[lVar24].m_backend.exp;
            local_e58.exp = iVar31;
            uVar46 = pnVar22[lVar24].m_backend.neg;
            local_e58.neg = (bool)uVar46;
            fVar48 = pnVar22[lVar24].m_backend.fpclass;
            iVar45 = pnVar22[lVar24].m_backend.prec_elem;
            local_e58.prec_elem = iVar45;
            local_e58.fpclass = fVar48;
            if (SVar4 == P_ON_LOWER) {
LAB_005d711d:
              pSVar26[lVar24] = P_ON_UPPER;
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.neg = false;
              local_f88.exp = 0;
              pcVar38 = &local_e58;
              pcVar23 = &local_f88;
              local_e58.exp = iVar31;
              local_e58.neg = (bool)uVar46;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_f88.prec_elem = iVar45;
              local_f88.fpclass = fVar48;
              local_f88.exp = iVar31;
              local_f88.neg = (bool)uVar46;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_f88,&local_dd8);
              pSVar47 = local_f08;
              pcVar38 = &local_f88;
              pcVar23 = &local_ee8;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_ee8.exp = local_f88.exp;
              local_ee8.neg = local_f88.neg;
              local_ee8.fpclass = local_f88.fpclass;
              local_ee8.prec_elem = local_f88.prec_elem;
              pSVar8 = (local_f08->
                       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver;
              pnVar22 = (pSVar8->theUBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar34;
              iVar20 = *(int *)&(pnVar22->m_backend).data;
              puVar39 = (pnVar22->m_backend).data._M_elems + 1;
              pcVar38 = &local_f88;
              for (lVar24 = 0x1b; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar38->data)._M_elems[0] = *puVar39;
                puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
              }
              uVar7 = (pnVar22->m_backend).fpclass;
              uVar17 = (pnVar22->m_backend).prec_elem;
              bVar1 = (pnVar22->m_backend).neg;
              iVar31 = (pnVar22->m_backend).exp;
              pnVar22 = (pSVar8->theLBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar34;
              *(int *)&(pnVar22->m_backend).data = iVar20;
              pcVar38 = &local_f88;
              puVar39 = (pnVar22->m_backend).data._M_elems + 1;
              for (lVar24 = 0x1b; lVar24 != 0; lVar24 = lVar24 + -1) {
                *puVar39 = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
              }
              (pnVar22->m_backend).exp = iVar31;
              (pnVar22->m_backend).neg = (bool)((iVar20 != 0 || uVar7 != 0) ^ bVar1);
              (pnVar22->m_backend).fpclass = uVar7;
              (pnVar22->m_backend).prec_elem = uVar17;
              ::soplex::infinity::__tls_init();
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.exp = 0;
              local_f88.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_f88,local_cc8);
              pnVar22 = (((pSVar47->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->theUBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar38 = &local_f88;
              pnVar37 = pnVar22 + lVar34;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar37->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              pnVar22[lVar34].m_backend.exp = local_f88.exp;
              pnVar22[lVar34].m_backend.neg = local_f88.neg;
              pnVar22[lVar34].m_backend.fpclass = local_f88.fpclass;
              pnVar22[lVar34].m_backend.prec_elem = local_f88.prec_elem;
            }
            else if (SVar4 == P_ON_UPPER) {
LAB_005d6d3a:
              pSVar26[lVar24] = P_ON_LOWER;
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.neg = false;
              local_f88.exp = 0;
              pcVar38 = &local_dd8;
              pcVar23 = &local_f88;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_f88.prec_elem = iVar29;
              local_f88.fpclass = fVar44;
              local_f88.exp = iVar20;
              local_f88.neg = (bool)uVar43;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_f88,&local_e58);
              pSVar47 = local_f08;
              pcVar38 = &local_f88;
              pcVar23 = &local_ee8;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_ee8.exp = local_f88.exp;
              local_ee8.neg = local_f88.neg;
              local_ee8.fpclass = local_f88.fpclass;
              local_ee8.prec_elem = local_f88.prec_elem;
              pSVar8 = (local_f08->
                       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver;
              pnVar22 = (pSVar8->theLBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar34;
              iVar20 = *(int *)&(pnVar22->m_backend).data;
              puVar39 = (pnVar22->m_backend).data._M_elems + 1;
              pcVar38 = &local_f88;
              for (lVar24 = 0x1b; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar38->data)._M_elems[0] = *puVar39;
                puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
              }
              uVar6 = (pnVar22->m_backend).fpclass;
              uVar16 = (pnVar22->m_backend).prec_elem;
              bVar1 = (pnVar22->m_backend).neg;
              iVar31 = (pnVar22->m_backend).exp;
              pnVar22 = (pSVar8->theUBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar34;
              *(int *)&(pnVar22->m_backend).data = iVar20;
              pcVar38 = &local_f88;
              puVar39 = (pnVar22->m_backend).data._M_elems + 1;
              for (lVar24 = 0x1b; lVar24 != 0; lVar24 = lVar24 + -1) {
                *puVar39 = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
              }
              (pnVar22->m_backend).exp = iVar31;
              (pnVar22->m_backend).neg = (bool)((iVar20 != 0 || uVar6 != 0) ^ bVar1);
              (pnVar22->m_backend).fpclass = uVar6;
              (pnVar22->m_backend).prec_elem = uVar16;
              ::soplex::infinity::__tls_init();
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.exp = 0;
              local_f88.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_f88,
                         (double)CONCAT44(uStack_cd4,local_cd8));
              pnVar22 = (((pSVar47->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->theLBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar38 = &local_f88;
              pnVar37 = pnVar22 + lVar34;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar37->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              pnVar22[lVar34].m_backend.exp = local_f88.exp;
              pnVar22[lVar34].m_backend.neg = local_f88.neg;
              pnVar22[lVar34].m_backend.fpclass = local_f88.fpclass;
              pnVar22[lVar34].m_backend.prec_elem = local_f88.prec_elem;
            }
            else {
              pSVar30 = pSVar8->spxout;
              iVar3 = local_f94 + 1;
              if ((pSVar30 != (SPxOut *)0x0) && (0 < (int)pSVar30->m_verbosity)) {
                local_f88.data._M_elems[0] = pSVar30->m_verbosity;
                local_ef4 = 1;
                (*pSVar30->_vptr_SPxOut[2])(pSVar30,&local_ef4);
                pSVar30 = ((pSVar47->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->spxout;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar30->m_streams[pSVar30->m_verbosity],"FVEC unexpected status: ",0x18)
                ;
                std::ostream::operator<<((ostream *)pSVar30->m_streams[pSVar30->m_verbosity],SVar4);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar30->m_streams[pSVar30->m_verbosity]," index: ",8);
                std::ostream::operator<<((ostream *)pSVar30->m_streams[pSVar30->m_verbosity],iVar21)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar30->m_streams[pSVar30->m_verbosity]," val: ",6);
                pnVar22 = (((pSVar47->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .thesolver)->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar37 = pnVar22 + lVar34;
                pnVar27 = &local_a20;
                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                  (pnVar27->m_backend).data._M_elems[0] = *(uint *)&pnVar37->m_backend;
                  pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_a20.m_backend.exp = pnVar22[lVar34].m_backend.exp;
                local_a20.m_backend.neg = pnVar22[lVar34].m_backend.neg;
                local_a20.m_backend.fpclass = pnVar22[lVar34].m_backend.fpclass;
                local_a20.m_backend.prec_elem = pnVar22[lVar34].m_backend.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar30->m_streams[pSVar30->m_verbosity],&local_a20);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar30->m_streams[pSVar30->m_verbosity]," upd: ",6);
                pnVar22 = (((pSVar47->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .thesolver)->theFvec->thedelta).
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar37 = pnVar22 + lVar34;
                pnVar27 = &local_aa0;
                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                  (pnVar27->m_backend).data._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
                  pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_aa0.m_backend.exp = pnVar22[lVar34].m_backend.exp;
                local_aa0.m_backend.neg = pnVar22[lVar34].m_backend.neg;
                local_aa0.m_backend.fpclass = pnVar22[lVar34].m_backend.fpclass;
                local_aa0.m_backend.prec_elem = pnVar22[lVar34].m_backend.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar30->m_streams[pSVar30->m_verbosity],&local_aa0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar30->m_streams[pSVar30->m_verbosity]," lower: ",8);
                pcVar38 = &local_e58;
                pnVar27 = &local_b20;
                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                  (pnVar27->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
                  pcVar38 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar38 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_b20.m_backend.exp = local_e58.exp;
                local_b20.m_backend.neg = local_e58.neg;
                local_b20.m_backend.fpclass = local_e58.fpclass;
                local_b20.m_backend.prec_elem = local_e58.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar30->m_streams[pSVar30->m_verbosity],&local_b20);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar30->m_streams[pSVar30->m_verbosity]," upper: ",8);
                pcVar38 = &local_dd8;
                pnVar27 = &local_ba0;
                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                  (pnVar27->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
                  pcVar38 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar38 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_ba0.m_backend.exp = local_dd8.exp;
                local_ba0.m_backend.neg = local_dd8.neg;
                local_ba0.m_backend.fpclass = local_dd8.fpclass;
                local_ba0.m_backend.prec_elem = local_dd8.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar30->m_streams[pSVar30->m_verbosity],&local_ba0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar30->m_streams[pSVar30->m_verbosity]," bp.val: ",9);
                pBVar12 = (pSVar47->breakpoints).data.
                          super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar27 = &local_c20;
                puVar39 = (uint *)((long)(pBVar12->val).m_backend.data._M_elems + local_f00);
                pnVar42 = pnVar27;
                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                  (pnVar42->m_backend).data._M_elems[0] = *puVar39;
                  puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
                  pnVar42 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar42 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_c20.m_backend.exp =
                     *(int *)((long)(&(pBVar12->val).m_backend.data + 1) + local_f00);
                local_c20.m_backend.neg =
                     *(bool *)((long)(&(pBVar12->val).m_backend.data + 1) + local_f00 + 4U);
                local_c20.m_backend._120_8_ =
                     *(undefined8 *)((long)(&(pBVar12->val).m_backend.data + 1) + local_f00 + 8U);
LAB_005d80c1:
                boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],pnVar27);
                cVar18 = (char)pSVar30->m_streams[pSVar30->m_verbosity];
                std::ios::widen((char)*(undefined8 *)
                                       (*(long *)pSVar30->m_streams[pSVar30->m_verbosity] + -0x18) +
                                cVar18);
                std::ostream::put(cVar18);
                std::ostream::flush();
                pSVar30 = ((pSVar47->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->spxout;
                (*pSVar30->_vptr_SPxOut[2])(pSVar30,&local_f88);
                iVar3 = local_f94 + 1;
              }
            }
          }
          local_f94 = iVar3;
          pcVar38 = &local_ee8;
          puVar39 = local_a0;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            *puVar39 = (pcVar38->data)._M_elems[0];
            pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
            puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
          }
          iVar3 = (pSVar47->updPrimRhs).super_IdxSet.num;
          (pSVar47->updPrimRhs).super_IdxSet.num = iVar3 + 1;
          pnVar22 = (pSVar47->updPrimRhs).
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          (pSVar47->updPrimRhs).super_IdxSet.idx[iVar3] = iVar21;
          puVar39 = local_a0;
          pnVar37 = pnVar22 + lVar34;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pnVar37->m_backend).data._M_elems[0] = *puVar39;
            puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
            pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
          }
          pnVar22[lVar34].m_backend.exp = local_ee8.exp;
          pnVar22[lVar34].m_backend.neg = local_ee8.neg;
          pnVar22[lVar34].m_backend.fpclass = local_ee8.fpclass;
          pnVar22[lVar34].m_backend.prec_elem = local_ee8.prec_elem;
          lVar24 = local_f00;
          lVar28 = local_ca8;
          nflips = local_cb0;
          this = pSVar47;
        }
        else if (iVar3 == 1) {
          pDVar9 = (pSVar8->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thedesc.costat;
          SVar4 = pDVar9->data[lVar34];
          pSVar8 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver;
          pnVar22 = (pSVar8->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar37 = pnVar22 + lVar34;
          pcVar38 = &local_dd8;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pcVar38->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
            pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
            pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
          }
          iVar3 = pnVar22[lVar34].m_backend.exp;
          local_dd8.exp = iVar3;
          bVar1 = pnVar22[lVar34].m_backend.neg;
          local_dd8.neg = bVar1;
          fVar44 = pnVar22[lVar34].m_backend.fpclass;
          iVar29 = pnVar22[lVar34].m_backend.prec_elem;
          local_dd8.prec_elem = iVar29;
          local_dd8.fpclass = fVar44;
          pnVar22 = (pSVar8->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar37 = pnVar22 + lVar34;
          pcVar38 = &local_e58;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pcVar38->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
            pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
            pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
          }
          iVar20 = pnVar22[lVar34].m_backend.exp;
          local_e58.exp = iVar20;
          bVar2 = pnVar22[lVar34].m_backend.neg;
          local_e58.neg = bVar2;
          fVar48 = pnVar22[lVar34].m_backend.fpclass;
          iVar45 = pnVar22[lVar34].m_backend.prec_elem;
          local_e58.prec_elem = iVar45;
          local_e58.fpclass = fVar48;
          if (SVar4 == P_ON_LOWER) {
            pDVar9->data[lVar34] = P_ON_UPPER;
            local_f88.fpclass = cpp_dec_float_finite;
            local_f88.prec_elem = 0x1c;
            local_f88.neg = false;
            local_f88.exp = 0;
            pcVar38 = &local_dd8;
            pcVar23 = &local_f88;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4);
            }
            local_f88.prec_elem = iVar29;
            local_f88.fpclass = fVar44;
            local_f88.exp = iVar3;
            local_f88.neg = bVar1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_f88,&local_e58);
            pSVar47 = local_f08;
            pcVar38 = &local_f88;
            pcVar23 = &local_ee8;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4);
            }
            local_ee8.exp = local_f88.exp;
            local_ee8.neg = local_f88.neg;
            local_ee8.fpclass = local_f88.fpclass;
            local_ee8.prec_elem = local_f88.prec_elem;
            pSVar8 = (local_f08->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver;
            puVar39 = (pSVar8->theCoUbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar34].m_backend.data._M_elems + 1;
            uVar32 = ((array_type *)(puVar39 + -1))->_M_elems[0];
            puVar36 = puVar39;
            pcVar38 = &local_f88;
            for (lVar24 = 0x1b; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pcVar38->data)._M_elems[0] = *puVar36;
              puVar36 = puVar36 + (ulong)bVar49 * -2 + 1;
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
            }
            uVar10 = *(undefined8 *)(puVar39 + 0x1d);
            uVar19 = puVar39[0x1c];
            uVar5 = puVar39[0x1b];
            pnVar22 = (pSVar8->theCoLbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar34;
            (pnVar22->m_backend).data._M_elems[0] = uVar32;
            pcVar38 = &local_f88;
            puVar39 = (pnVar22->m_backend).data._M_elems + 1;
            for (lVar24 = 0x1b; lVar24 != 0; lVar24 = lVar24 + -1) {
              *puVar39 = (pcVar38->data)._M_elems[0];
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
              puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
            }
            (pnVar22->m_backend).exp = uVar5;
            (pnVar22->m_backend).neg = (bool)((uVar32 != 0 || (int)uVar10 != 0) ^ (byte)uVar19);
            (pnVar22->m_backend).fpclass = (int)uVar10;
            (pnVar22->m_backend).prec_elem = (int)((ulong)uVar10 >> 0x20);
            ::soplex::infinity::__tls_init();
            local_f88.fpclass = cpp_dec_float_finite;
            local_f88.prec_elem = 0x1c;
            local_f88.data._M_elems[0] = 0;
            local_f88.data._M_elems[1] = 0;
            local_f88.data._M_elems[2] = 0;
            local_f88.data._M_elems[3] = 0;
            local_f88.data._M_elems[4] = 0;
            local_f88.data._M_elems[5] = 0;
            local_f88.data._M_elems[6] = 0;
            local_f88.data._M_elems[7] = 0;
            local_f88.data._M_elems[8] = 0;
            local_f88.data._M_elems[9] = 0;
            local_f88.data._M_elems[10] = 0;
            local_f88.data._M_elems[0xb] = 0;
            local_f88.data._M_elems[0xc] = 0;
            local_f88.data._M_elems[0xd] = 0;
            local_f88.data._M_elems[0xe] = 0;
            local_f88.data._M_elems[0xf] = 0;
            local_f88.data._M_elems[0x10] = 0;
            local_f88.data._M_elems[0x11] = 0;
            local_f88.data._M_elems[0x12] = 0;
            local_f88.data._M_elems[0x13] = 0;
            local_f88.data._M_elems[0x14] = 0;
            local_f88.data._M_elems[0x15] = 0;
            local_f88.data._M_elems[0x16] = 0;
            local_f88.data._M_elems[0x17] = 0;
            local_f88.data._M_elems[0x18] = 0;
            local_f88.data._M_elems[0x19] = 0;
            local_f88.data._M_elems._104_5_ = 0;
            local_f88.data._M_elems[0x1b]._1_3_ = 0;
            local_f88.exp = 0;
            local_f88.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_f88,local_cc8);
            pnVar22 = (((pSVar47->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->theCoUbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar38 = &local_f88;
            pnVar37 = pnVar22 + lVar34;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pnVar37->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
              pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
            }
            pnVar22[lVar34].m_backend.exp = local_f88.exp;
            pnVar22[lVar34].m_backend.neg = local_f88.neg;
            pnVar22[lVar34].m_backend.fpclass = local_f88.fpclass;
            pnVar22[lVar34].m_backend.prec_elem = local_f88.prec_elem;
            pcVar23 = &(((pSVar47->
                         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver)->theCoLbound->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar34].m_backend;
            local_f88.fpclass = cpp_dec_float_finite;
            local_f88.prec_elem = 0x1c;
            local_f88.data._M_elems[0] = 0;
            local_f88.data._M_elems[1] = 0;
            local_f88.data._M_elems[2] = 0;
            local_f88.data._M_elems[3] = 0;
            local_f88.data._M_elems[4] = 0;
            local_f88.data._M_elems[5] = 0;
            local_f88.data._M_elems[6] = 0;
            local_f88.data._M_elems[7] = 0;
            local_f88.data._M_elems[8] = 0;
            local_f88.data._M_elems[9] = 0;
            local_f88.data._M_elems[10] = 0;
            local_f88.data._M_elems[0xb] = 0;
            local_f88.data._M_elems[0xc] = 0;
            local_f88.data._M_elems[0xd] = 0;
            local_f88.data._M_elems[0xe] = 0;
            local_f88.data._M_elems[0xf] = 0;
            local_f88.data._M_elems[0x10] = 0;
            local_f88.data._M_elems[0x11] = 0;
            local_f88.data._M_elems[0x12] = 0;
            local_f88.data._M_elems[0x13] = 0;
            local_f88.data._M_elems[0x14] = 0;
            local_f88.data._M_elems[0x15] = 0;
            local_f88.data._M_elems[0x16] = 0;
            local_f88.data._M_elems[0x17] = 0;
            local_f88.data._M_elems[0x18] = 0;
            local_f88.data._M_elems[0x19] = 0;
            local_f88.data._M_elems._104_5_ = 0;
            local_f88.data._M_elems[0x1b]._1_3_ = 0;
            local_f88.exp = 0;
            local_f88.neg = false;
            pcVar38 = &local_ee8;
            if (&local_f88 != pcVar23) {
LAB_005d678a:
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              pcVar38 = &local_ee8;
              pcVar41 = &local_f88;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar41->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_f88.exp = local_ee8.exp;
              local_f88.neg = local_ee8.neg;
              local_f88.fpclass = local_ee8.fpclass;
              local_f88.prec_elem = local_ee8.prec_elem;
              pcVar38 = pcVar23;
            }
LAB_005d67c6:
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_f88,pcVar38);
            pcVar38 = &local_f88;
            pcVar23 = &local_d58;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4);
            }
            local_d58.exp = local_f88.exp;
            local_d58.neg = local_f88.neg;
            local_d58.fpclass = local_f88.fpclass;
            local_d58.prec_elem = local_f88.prec_elem;
          }
          else {
            if (SVar4 == P_ON_UPPER) {
              pDVar9->data[lVar34] = P_ON_LOWER;
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.neg = false;
              local_f88.exp = 0;
              pcVar38 = &local_e58;
              pcVar23 = &local_f88;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_f88.prec_elem = iVar45;
              local_f88.fpclass = fVar48;
              local_f88.exp = iVar20;
              local_f88.neg = bVar2;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_f88,&local_dd8);
              pSVar47 = local_f08;
              pcVar38 = &local_f88;
              pcVar23 = &local_ee8;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_ee8.exp = local_f88.exp;
              local_ee8.neg = local_f88.neg;
              local_ee8.fpclass = local_f88.fpclass;
              local_ee8.prec_elem = local_f88.prec_elem;
              pSVar8 = (local_f08->
                       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver;
              puVar39 = (pSVar8->theCoLbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar34].m_backend.data._M_elems +
                        1;
              uVar32 = ((array_type *)(puVar39 + -1))->_M_elems[0];
              puVar36 = puVar39;
              pcVar38 = &local_f88;
              for (lVar24 = 0x1b; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar38->data)._M_elems[0] = *puVar36;
                puVar36 = puVar36 + (ulong)bVar49 * -2 + 1;
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
              }
              uVar10 = *(undefined8 *)(puVar39 + 0x1d);
              uVar19 = puVar39[0x1c];
              uVar5 = puVar39[0x1b];
              pnVar22 = (pSVar8->theCoUbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar34;
              (pnVar22->m_backend).data._M_elems[0] = uVar32;
              pcVar38 = &local_f88;
              puVar39 = (pnVar22->m_backend).data._M_elems + 1;
              for (lVar24 = 0x1b; lVar24 != 0; lVar24 = lVar24 + -1) {
                *puVar39 = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
              }
              (pnVar22->m_backend).exp = uVar5;
              (pnVar22->m_backend).neg = (bool)((uVar32 != 0 || (int)uVar10 != 0) ^ (byte)uVar19);
              (pnVar22->m_backend).fpclass = (int)uVar10;
              (pnVar22->m_backend).prec_elem = (int)((ulong)uVar10 >> 0x20);
              ::soplex::infinity::__tls_init();
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.exp = 0;
              local_f88.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_f88,
                         (double)CONCAT44(uStack_cd4,local_cd8));
              pnVar22 = (((pSVar47->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->theCoLbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar38 = &local_f88;
              pnVar37 = pnVar22 + lVar34;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar37->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              pnVar22[lVar34].m_backend.exp = local_f88.exp;
              pnVar22[lVar34].m_backend.neg = local_f88.neg;
              pnVar22[lVar34].m_backend.fpclass = local_f88.fpclass;
              pnVar22[lVar34].m_backend.prec_elem = local_f88.prec_elem;
              pcVar23 = &(((pSVar47->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->theCoUbound->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar34].m_backend;
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.exp = 0;
              local_f88.neg = false;
              pcVar38 = &local_ee8;
              if (&local_f88 != pcVar23) goto LAB_005d678a;
              goto LAB_005d67c6;
            }
            local_f94 = local_f94 + 1;
            pSVar30 = pSVar8->spxout;
            if ((pSVar30 != (SPxOut *)0x0) && (0 < (int)pSVar30->m_verbosity)) {
              local_f88.data._M_elems[0] = pSVar30->m_verbosity;
              local_ef0.info = 1;
              (*pSVar30->_vptr_SPxOut[2])(pSVar30,&local_ef0);
              pSVar30 = ((pSVar47->
                         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver)->spxout;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity],"COPVEC unexpected status: ",0x1a)
              ;
              std::ostream::operator<<((ostream *)pSVar30->m_streams[pSVar30->m_verbosity],SVar4);
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," index: ",8);
              std::ostream::operator<<((ostream *)pSVar30->m_streams[pSVar30->m_verbosity],iVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," val: ",6);
              pnVar22 = (((pSVar47->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->theCoPvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar37 = pnVar22 + lVar34;
              pnVar27 = &local_4a0;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = *(uint *)&pnVar37->m_backend;
                pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_4a0.m_backend.exp = pnVar22[lVar34].m_backend.exp;
              local_4a0.m_backend.neg = pnVar22[lVar34].m_backend.neg;
              local_4a0.m_backend.fpclass = pnVar22[lVar34].m_backend.fpclass;
              local_4a0.m_backend.prec_elem = pnVar22[lVar34].m_backend.prec_elem;
              boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],&local_4a0)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," upd: ",6);
              pnVar22 = (((pSVar47->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->theCoPvec->thedelta).
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar37 = pnVar22 + lVar34;
              pnVar27 = &local_520;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
                pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_520.m_backend.exp = pnVar22[lVar34].m_backend.exp;
              local_520.m_backend.neg = pnVar22[lVar34].m_backend.neg;
              local_520.m_backend.fpclass = pnVar22[lVar34].m_backend.fpclass;
              local_520.m_backend.prec_elem = pnVar22[lVar34].m_backend.prec_elem;
              boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],&local_520)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," lower: ",8);
              pcVar38 = &local_e58;
              pnVar27 = &local_5a0;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar38 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_5a0.m_backend.exp = local_e58.exp;
              local_5a0.m_backend.neg = local_e58.neg;
              local_5a0.m_backend.fpclass = local_e58.fpclass;
              local_5a0.m_backend.prec_elem = local_e58.prec_elem;
              boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],&local_5a0)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," upper: ",8);
              pcVar38 = &local_dd8;
              pnVar27 = &local_620;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar38 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_620.m_backend.exp = local_dd8.exp;
              local_620.m_backend.neg = local_dd8.neg;
              local_620.m_backend.fpclass = local_dd8.fpclass;
              local_620.m_backend.prec_elem = local_dd8.prec_elem;
              boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],&local_620)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," bp.val: ",9);
              pBVar12 = (pSVar47->breakpoints).data.
                        super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar39 = (uint *)((long)(pBVar12->val).m_backend.data._M_elems + local_f00);
              pnVar27 = &local_6a0;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = *puVar39;
                puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_6a0.m_backend.exp =
                   *(int *)((long)(&(pBVar12->val).m_backend.data + 1) + local_f00);
              local_6a0.m_backend.neg =
                   *(bool *)((long)(&(pBVar12->val).m_backend.data + 1) + local_f00 + 4U);
              local_6a0.m_backend._120_8_ =
                   *(undefined8 *)((long)(&(pBVar12->val).m_backend.data + 1) + local_f00 + 8U);
              boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],&local_6a0)
              ;
              cVar18 = (char)pSVar30->m_streams[pSVar30->m_verbosity];
              std::ios::widen((char)*(undefined8 *)
                                     (*(long *)pSVar30->m_streams[pSVar30->m_verbosity] + -0x18) +
                              cVar18);
              std::ostream::put(cVar18);
              std::ostream::flush();
              pSVar30 = ((pSVar47->
                         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver)->spxout;
              (*pSVar30->_vptr_SPxOut[2])(pSVar30,&local_f88);
            }
          }
          pnVar22 = (pSVar47->updPrimRhs).
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar37 = pnVar22 + lVar34;
          pcVar38 = &local_f88;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pcVar38->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
            pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
            pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
          }
          iVar3 = pnVar22[lVar34].m_backend.exp;
          bVar1 = pnVar22[lVar34].m_backend.neg;
          uVar10._0_4_ = pnVar22[lVar34].m_backend.fpclass;
          uVar10._4_4_ = pnVar22[lVar34].m_backend.prec_elem;
          local_ca0.fpclass = cpp_dec_float_finite;
          local_ca0.prec_elem = 0x1c;
          local_ca0.neg = false;
          local_ca0.exp = 0;
          pcVar38 = &local_f88;
          pcVar23 = &local_ca0;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
            pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4);
          }
          local_ca0.exp = iVar3;
          local_ca0.neg = bVar1;
          local_ca0._120_8_ = uVar10;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_ca0,&local_ee8);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setValue(local_e60,iVar21,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_ca0);
          this = pSVar47;
          if (local_d58.fpclass != cpp_dec_float_NaN) {
            local_f88.fpclass = cpp_dec_float_finite;
            local_f88.prec_elem = 0x1c;
            local_f88.data._M_elems[0] = 0;
            local_f88.data._M_elems[1] = 0;
            local_f88.data._M_elems[2] = 0;
            local_f88.data._M_elems[3] = 0;
            local_f88.data._M_elems[4] = 0;
            local_f88.data._M_elems[5] = 0;
            local_f88.data._M_elems[6] = 0;
            local_f88.data._M_elems[7] = 0;
            local_f88.data._M_elems[8] = 0;
            local_f88.data._M_elems[9] = 0;
            local_f88.data._M_elems[10] = 0;
            local_f88.data._M_elems[0xb] = 0;
            local_f88.data._M_elems[0xc] = 0;
            local_f88.data._M_elems[0xd] = 0;
            local_f88.data._M_elems[0xe] = 0;
            local_f88.data._M_elems[0xf] = 0;
            local_f88.data._M_elems[0x10] = 0;
            local_f88.data._M_elems[0x11] = 0;
            local_f88.data._M_elems[0x12] = 0;
            local_f88.data._M_elems[0x13] = 0;
            local_f88.data._M_elems[0x14] = 0;
            local_f88.data._M_elems[0x15] = 0;
            local_f88.data._M_elems[0x16] = 0;
            local_f88.data._M_elems[0x17] = 0;
            local_f88.data._M_elems[0x18] = 0;
            local_f88.data._M_elems[0x19] = 0;
            local_f88.data._M_elems._104_5_ = 0;
            local_f88.data._M_elems[0x1b]._1_3_ = 0;
            local_f88.exp = 0;
            local_f88.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_f88,0.0);
            iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_d58,&local_f88);
            lVar24 = local_f00;
            lVar28 = local_ca8;
            nflips = local_cb0;
            if (iVar21 == 0) goto LAB_005d8284;
          }
          pSVar8 = (pSVar47->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver;
          pcVar38 = &local_d58;
          pnVar27 = &local_720;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pnVar27->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
            pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
            pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
          }
          local_720.m_backend.exp = local_d58.exp;
          local_720.m_backend.neg = local_d58.neg;
          local_720.m_backend.fpclass = local_d58.fpclass;
          local_720.m_backend.prec_elem = local_d58.prec_elem;
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::updateNonbasicValue(pSVar8,&local_720);
          lVar24 = local_f00;
          lVar28 = local_ca8;
          nflips = local_cb0;
        }
        else {
          lVar24 = local_f00;
          lVar28 = local_ca8;
          nflips = local_cb0;
          if (iVar3 != 0) goto LAB_005d8284;
          pDVar9 = (pSVar8->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thedesc.stat;
          SVar4 = pDVar9->data[lVar34];
          pSVar8 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver;
          pnVar22 = (pSVar8->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar37 = pnVar22 + lVar34;
          pcVar38 = &local_dd8;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pcVar38->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
            pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
            pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
          }
          iVar3 = pnVar22[lVar34].m_backend.exp;
          local_dd8.exp = iVar3;
          bVar1 = pnVar22[lVar34].m_backend.neg;
          local_dd8.neg = bVar1;
          fVar44 = pnVar22[lVar34].m_backend.fpclass;
          iVar29 = pnVar22[lVar34].m_backend.prec_elem;
          local_dd8.prec_elem = iVar29;
          local_dd8.fpclass = fVar44;
          pnVar22 = (pSVar8->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar37 = pnVar22 + lVar34;
          pcVar38 = &local_e58;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pcVar38->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
            pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
            pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
          }
          iVar20 = pnVar22[lVar34].m_backend.exp;
          local_e58.exp = iVar20;
          bVar2 = pnVar22[lVar34].m_backend.neg;
          local_e58.neg = bVar2;
          fVar48 = pnVar22[lVar34].m_backend.fpclass;
          iVar45 = pnVar22[lVar34].m_backend.prec_elem;
          local_e58.prec_elem = iVar45;
          local_e58.fpclass = fVar48;
          if (SVar4 == P_ON_LOWER) {
            pDVar9->data[lVar34] = P_ON_UPPER;
            local_f88.fpclass = cpp_dec_float_finite;
            local_f88.prec_elem = 0x1c;
            local_f88.neg = false;
            local_f88.exp = 0;
            pcVar38 = &local_dd8;
            pcVar23 = &local_f88;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4);
            }
            local_f88.prec_elem = iVar29;
            local_f88.fpclass = fVar44;
            local_f88.exp = iVar3;
            local_f88.neg = bVar1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_f88,&local_e58);
            pSVar47 = local_f08;
            pcVar38 = &local_f88;
            pcVar23 = &local_ee8;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4);
            }
            local_ee8.exp = local_f88.exp;
            local_ee8.neg = local_f88.neg;
            local_ee8.fpclass = local_f88.fpclass;
            local_ee8.prec_elem = local_f88.prec_elem;
            pSVar8 = (local_f08->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver;
            pnVar22 = (pSVar8->theLbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar37 = (pSVar8->theUbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar35 = pnVar22 + lVar34;
            pnVar40 = pnVar37 + lVar34;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pnVar40->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
              pnVar35 = (pointer)((long)pnVar35 + ((ulong)bVar49 * -2 + 1) * 4);
              pnVar40 = (pointer)((long)pnVar40 + ((ulong)bVar49 * -2 + 1) * 4);
            }
            pnVar37[lVar34].m_backend.exp = pnVar22[lVar34].m_backend.exp;
            pnVar37[lVar34].m_backend.neg = pnVar22[lVar34].m_backend.neg;
            iVar29 = pnVar22[lVar34].m_backend.prec_elem;
            pnVar37[lVar34].m_backend.fpclass = pnVar22[lVar34].m_backend.fpclass;
            pnVar37[lVar34].m_backend.prec_elem = iVar29;
            ::soplex::infinity::__tls_init();
            local_f88.fpclass = cpp_dec_float_finite;
            local_f88.prec_elem = 0x1c;
            local_f88.data._M_elems[0] = 0;
            local_f88.data._M_elems[1] = 0;
            local_f88.data._M_elems[2] = 0;
            local_f88.data._M_elems[3] = 0;
            local_f88.data._M_elems[4] = 0;
            local_f88.data._M_elems[5] = 0;
            local_f88.data._M_elems[6] = 0;
            local_f88.data._M_elems[7] = 0;
            local_f88.data._M_elems[8] = 0;
            local_f88.data._M_elems[9] = 0;
            local_f88.data._M_elems[10] = 0;
            local_f88.data._M_elems[0xb] = 0;
            local_f88.data._M_elems[0xc] = 0;
            local_f88.data._M_elems[0xd] = 0;
            local_f88.data._M_elems[0xe] = 0;
            local_f88.data._M_elems[0xf] = 0;
            local_f88.data._M_elems[0x10] = 0;
            local_f88.data._M_elems[0x11] = 0;
            local_f88.data._M_elems[0x12] = 0;
            local_f88.data._M_elems[0x13] = 0;
            local_f88.data._M_elems[0x14] = 0;
            local_f88.data._M_elems[0x15] = 0;
            local_f88.data._M_elems[0x16] = 0;
            local_f88.data._M_elems[0x17] = 0;
            local_f88.data._M_elems[0x18] = 0;
            local_f88.data._M_elems[0x19] = 0;
            local_f88.data._M_elems._104_5_ = 0;
            local_f88.data._M_elems[0x1b]._1_3_ = 0;
            local_f88.exp = 0;
            local_f88.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_f88,
                       (double)CONCAT44(uStack_cd4,local_cd8));
            pnVar22 = (((pSVar47->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->theLbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar38 = &local_f88;
            pnVar37 = pnVar22 + lVar34;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pnVar37->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
              pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
            }
            pnVar22[lVar34].m_backend.exp = local_f88.exp;
            pnVar22[lVar34].m_backend.neg = local_f88.neg;
            pnVar22[lVar34].m_backend.fpclass = local_f88.fpclass;
            pnVar22[lVar34].m_backend.prec_elem = local_f88.prec_elem;
            pcVar23 = &(((pSVar47->
                         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver)->theUbound->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar34].m_backend;
            local_f88.fpclass = cpp_dec_float_finite;
            local_f88.prec_elem = 0x1c;
            local_f88.data._M_elems[0] = 0;
            local_f88.data._M_elems[1] = 0;
            local_f88.data._M_elems[2] = 0;
            local_f88.data._M_elems[3] = 0;
            local_f88.data._M_elems[4] = 0;
            local_f88.data._M_elems[5] = 0;
            local_f88.data._M_elems[6] = 0;
            local_f88.data._M_elems[7] = 0;
            local_f88.data._M_elems[8] = 0;
            local_f88.data._M_elems[9] = 0;
            local_f88.data._M_elems[10] = 0;
            local_f88.data._M_elems[0xb] = 0;
            local_f88.data._M_elems[0xc] = 0;
            local_f88.data._M_elems[0xd] = 0;
            local_f88.data._M_elems[0xe] = 0;
            local_f88.data._M_elems[0xf] = 0;
            local_f88.data._M_elems[0x10] = 0;
            local_f88.data._M_elems[0x11] = 0;
            local_f88.data._M_elems[0x12] = 0;
            local_f88.data._M_elems[0x13] = 0;
            local_f88.data._M_elems[0x14] = 0;
            local_f88.data._M_elems[0x15] = 0;
            local_f88.data._M_elems[0x16] = 0;
            local_f88.data._M_elems[0x17] = 0;
            local_f88.data._M_elems[0x18] = 0;
            local_f88.data._M_elems[0x19] = 0;
            local_f88.data._M_elems._104_5_ = 0;
            local_f88.data._M_elems[0x1b]._1_3_ = 0;
            local_f88.exp = 0;
            local_f88.neg = false;
            pcVar38 = &local_ee8;
            if (&local_f88 != pcVar23) {
LAB_005d6413:
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              pcVar38 = &local_ee8;
              pcVar41 = &local_f88;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar41->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_f88.exp = local_ee8.exp;
              local_f88.neg = local_ee8.neg;
              local_f88.fpclass = local_ee8.fpclass;
              local_f88.prec_elem = local_ee8.prec_elem;
              pcVar38 = pcVar23;
            }
LAB_005d644f:
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_f88,pcVar38);
            pcVar38 = &local_f88;
            pcVar23 = &local_d58;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4);
            }
            local_d58.exp = local_f88.exp;
            local_d58.neg = local_f88.neg;
            local_d58.fpclass = local_f88.fpclass;
            local_d58.prec_elem = local_f88.prec_elem;
          }
          else {
            if (SVar4 == P_ON_UPPER) {
              pDVar9->data[lVar34] = P_ON_LOWER;
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.neg = false;
              local_f88.exp = 0;
              pcVar38 = &local_e58;
              pcVar23 = &local_f88;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_f88.prec_elem = iVar45;
              local_f88.fpclass = fVar48;
              local_f88.exp = iVar20;
              local_f88.neg = bVar2;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_f88,&local_dd8);
              pSVar47 = local_f08;
              pcVar38 = &local_f88;
              pcVar23 = &local_ee8;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar23->data)._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_ee8.exp = local_f88.exp;
              local_ee8.neg = local_f88.neg;
              local_ee8.fpclass = local_f88.fpclass;
              local_ee8.prec_elem = local_f88.prec_elem;
              pSVar8 = (local_f08->
                       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver;
              pnVar22 = (pSVar8->theUbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar37 = (pSVar8->theLbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar35 = pnVar22 + lVar34;
              pnVar40 = pnVar37 + lVar34;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar40->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
                pnVar35 = (pointer)((long)pnVar35 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar40 = (pointer)((long)pnVar40 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              pnVar37[lVar34].m_backend.exp = pnVar22[lVar34].m_backend.exp;
              pnVar37[lVar34].m_backend.neg = pnVar22[lVar34].m_backend.neg;
              iVar29 = pnVar22[lVar34].m_backend.prec_elem;
              pnVar37[lVar34].m_backend.fpclass = pnVar22[lVar34].m_backend.fpclass;
              pnVar37[lVar34].m_backend.prec_elem = iVar29;
              ::soplex::infinity::__tls_init();
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.exp = 0;
              local_f88.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_f88,local_cc8);
              pnVar22 = (((pSVar47->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->theUbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar38 = &local_f88;
              pnVar37 = pnVar22 + lVar34;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar37->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4)
                ;
                pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              pnVar22[lVar34].m_backend.exp = local_f88.exp;
              pnVar22[lVar34].m_backend.neg = local_f88.neg;
              pnVar22[lVar34].m_backend.fpclass = local_f88.fpclass;
              pnVar22[lVar34].m_backend.prec_elem = local_f88.prec_elem;
              pcVar23 = &(((pSVar47->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->theLbound->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar34].m_backend;
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.exp = 0;
              local_f88.neg = false;
              pcVar38 = &local_ee8;
              if (&local_f88 != pcVar23) goto LAB_005d6413;
              goto LAB_005d644f;
            }
            local_f94 = local_f94 + 1;
            pSVar30 = pSVar8->spxout;
            if ((pSVar30 != (SPxOut *)0x0) && (0 < (int)pSVar30->m_verbosity)) {
              local_f88.data._M_elems[0] = pSVar30->m_verbosity;
              local_ef0.info = 1;
              (*pSVar30->_vptr_SPxOut[2])(pSVar30,&local_ef0);
              pSVar30 = ((pSVar47->
                         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver)->spxout;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity],"PVEC unexpected status: ",0x18);
              std::ostream::operator<<((ostream *)pSVar30->m_streams[pSVar30->m_verbosity],SVar4);
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," index: ",8);
              std::ostream::operator<<((ostream *)pSVar30->m_streams[pSVar30->m_verbosity],iVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," val: ",6);
              pnVar22 = (((pSVar47->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->thePvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar37 = pnVar22 + lVar34;
              pnVar27 = &local_120;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = *(uint *)&pnVar37->m_backend;
                pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_120.m_backend.exp = pnVar22[lVar34].m_backend.exp;
              local_120.m_backend.neg = pnVar22[lVar34].m_backend.neg;
              local_120.m_backend.fpclass = pnVar22[lVar34].m_backend.fpclass;
              local_120.m_backend.prec_elem = pnVar22[lVar34].m_backend.prec_elem;
              boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],&local_120)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," upd: ",6);
              pnVar22 = (((pSVar47->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->thePvec->thedelta).
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar37 = pnVar22 + lVar34;
              pnVar27 = &local_1a0;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
                pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_1a0.m_backend.exp = pnVar22[lVar34].m_backend.exp;
              local_1a0.m_backend.neg = pnVar22[lVar34].m_backend.neg;
              local_1a0.m_backend.fpclass = pnVar22[lVar34].m_backend.fpclass;
              local_1a0.m_backend.prec_elem = pnVar22[lVar34].m_backend.prec_elem;
              boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],&local_1a0)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," lower: ",8);
              pcVar38 = &local_e58;
              pnVar27 = &local_220;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar38 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_220.m_backend.exp = local_e58.exp;
              local_220.m_backend.neg = local_e58.neg;
              local_220.m_backend.fpclass = local_e58.fpclass;
              local_220.m_backend.prec_elem = local_e58.prec_elem;
              boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],&local_220)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," upper: ",8);
              pcVar38 = &local_dd8;
              pnVar27 = &local_2a0;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
                pcVar38 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar38 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_2a0.m_backend.exp = local_dd8.exp;
              local_2a0.m_backend.neg = local_dd8.neg;
              local_2a0.m_backend.fpclass = local_dd8.fpclass;
              local_2a0.m_backend.prec_elem = local_dd8.prec_elem;
              boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],&local_2a0)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar30->m_streams[pSVar30->m_verbosity]," bp.val: ",9);
              pBVar12 = (pSVar47->breakpoints).data.
                        super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar39 = (uint *)((long)(pBVar12->val).m_backend.data._M_elems + local_f00);
              pnVar27 = &local_320;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = *puVar39;
                puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_320.m_backend.exp =
                   *(int *)((long)(&(pBVar12->val).m_backend.data + 1) + local_f00);
              local_320.m_backend.neg =
                   *(bool *)((long)(&(pBVar12->val).m_backend.data + 1) + local_f00 + 4U);
              local_320.m_backend._120_8_ =
                   *(undefined8 *)((long)(&(pBVar12->val).m_backend.data + 1) + local_f00 + 8U);
              boost::multiprecision::operator<<(pSVar30->m_streams[pSVar30->m_verbosity],&local_320)
              ;
              cVar18 = (char)pSVar30->m_streams[pSVar30->m_verbosity];
              std::ios::widen((char)*(undefined8 *)
                                     (*(long *)pSVar30->m_streams[pSVar30->m_verbosity] + -0x18) +
                              cVar18);
              std::ostream::put(cVar18);
              std::ostream::flush();
              pSVar30 = ((pSVar47->
                         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver)->spxout;
              (*pSVar30->_vptr_SPxOut[2])(pSVar30,&local_f88);
            }
          }
          pSVar8 = (pSVar47->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver;
          pcVar38 = &local_ee8;
          pnVar27 = &local_3a0;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pnVar27->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
            pcVar38 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar38 + ((ulong)bVar49 * -2 + 1) * 4);
            pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
          }
          local_3a0.m_backend.exp = local_ee8.exp;
          local_3a0.m_backend.neg = local_ee8.neg;
          local_3a0.m_backend.fpclass = local_ee8.fpclass;
          local_3a0.m_backend.prec_elem = local_ee8.prec_elem;
          pSVar13 = pSVar8->thevectors;
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          ::
          multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)local_e60,&local_3a0,
                     (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((pSVar13->set).theitem + (pSVar13->set).thekey[lVar34].idx));
          this = pSVar47;
          if (local_d58.fpclass != cpp_dec_float_NaN) {
            local_f88.fpclass = cpp_dec_float_finite;
            local_f88.prec_elem = 0x1c;
            local_f88.data._M_elems[0] = 0;
            local_f88.data._M_elems[1] = 0;
            local_f88.data._M_elems[2] = 0;
            local_f88.data._M_elems[3] = 0;
            local_f88.data._M_elems[4] = 0;
            local_f88.data._M_elems[5] = 0;
            local_f88.data._M_elems[6] = 0;
            local_f88.data._M_elems[7] = 0;
            local_f88.data._M_elems[8] = 0;
            local_f88.data._M_elems[9] = 0;
            local_f88.data._M_elems[10] = 0;
            local_f88.data._M_elems[0xb] = 0;
            local_f88.data._M_elems[0xc] = 0;
            local_f88.data._M_elems[0xd] = 0;
            local_f88.data._M_elems[0xe] = 0;
            local_f88.data._M_elems[0xf] = 0;
            local_f88.data._M_elems[0x10] = 0;
            local_f88.data._M_elems[0x11] = 0;
            local_f88.data._M_elems[0x12] = 0;
            local_f88.data._M_elems[0x13] = 0;
            local_f88.data._M_elems[0x14] = 0;
            local_f88.data._M_elems[0x15] = 0;
            local_f88.data._M_elems[0x16] = 0;
            local_f88.data._M_elems[0x17] = 0;
            local_f88.data._M_elems[0x18] = 0;
            local_f88.data._M_elems[0x19] = 0;
            local_f88.data._M_elems._104_5_ = 0;
            local_f88.data._M_elems[0x1b]._1_3_ = 0;
            local_f88.exp = 0;
            local_f88.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_f88,0.0);
            iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_d58,&local_f88);
            lVar24 = local_f00;
            lVar28 = local_ca8;
            nflips = local_cb0;
            if (iVar21 == 0) goto LAB_005d8284;
          }
          pSVar8 = (pSVar47->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver;
          pcVar38 = &local_d58;
          pnVar27 = &local_420;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pnVar27->m_backend).data._M_elems[0] = (pcVar38->data)._M_elems[0];
            pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
            pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar27 + ((ulong)bVar49 * -2 + 1) * 4);
          }
          local_420.m_backend.exp = local_d58.exp;
          local_420.m_backend.neg = local_d58.neg;
          local_420.m_backend.fpclass = local_d58.fpclass;
          local_420.m_backend.prec_elem = local_d58.prec_elem;
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::updateNonbasicValue(pSVar8,&local_420);
          lVar24 = local_f00;
          lVar28 = local_ca8;
          nflips = local_cb0;
        }
      }
LAB_005d8284:
      lVar28 = lVar28 + 1;
      iVar21 = *nflips;
      lVar24 = lVar24 + 0x88;
    } while (lVar28 < iVar21);
  }
  *nflips = iVar21 - local_f94;
  if (iVar21 - local_f94 != 0 && local_f94 <= iVar21) {
    pSVar8 = (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thesolver;
    bVar1 = (this->updPrimRhs).setupStatus;
    if (pSVar8->theRep == ROW) {
      pVVar14 = pSVar8->theCoPrhs;
      if (bVar1 == false) {
        lVar28 = 0xa50;
        lVar24 = 0xa48;
        uVar32 = (uint)((ulong)((long)(pVVar14->val).
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pVVar14->val).
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 7);
        if (0 < (int)uVar32) {
          uVar33 = (ulong)(uVar32 & 0x7fffffff);
          lVar28 = uVar33 + 1;
          lVar34 = uVar33 << 7;
          do {
            pnVar22 = (this->updPrimRhs).
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar39 = (uint *)((long)pnVar22[-1].m_backend.data._M_elems + lVar34);
            pcVar38 = &local_f88;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar38->data)._M_elems[0] = *puVar39;
              puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
            }
            local_f88.exp = *(int *)((long)(&pnVar22[-1].m_backend.data + 1) + lVar34);
            local_f88.neg = *(bool *)((long)(&pnVar22[-1].m_backend.data + 1) + lVar34 + 4U);
            local_f88._120_8_ =
                 *(undefined8 *)((long)(&pnVar22[-1].m_backend.data + 1) + lVar34 + 8U);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)
                       ((long)(pVVar14->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                       + lVar34),&local_f88);
            lVar28 = lVar28 + -1;
            lVar34 = lVar34 + -0x80;
          } while (1 < lVar28);
          lVar28 = 0xa50;
        }
      }
      else {
        lVar34 = (long)(this->updPrimRhs).super_IdxSet.num;
        lVar28 = 0xa50;
        lVar24 = 0xa48;
        if (0 < lVar34) {
          lVar34 = lVar34 + 1;
          do {
            piVar15 = (this->updPrimRhs).super_IdxSet.idx;
            pnVar22 = (this->updPrimRhs).
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar21 = piVar15[lVar34 + -2];
            pnVar37 = pnVar22 + iVar21;
            pcVar38 = &local_f88;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar38->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
              pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
            }
            local_f88.exp = pnVar22[iVar21].m_backend.exp;
            local_f88.neg = pnVar22[iVar21].m_backend.neg;
            local_f88.fpclass = pnVar22[iVar21].m_backend.fpclass;
            local_f88.prec_elem = pnVar22[iVar21].m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&(pVVar14->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar15[lVar34 + -2]].m_backend,
                       &local_f88);
            lVar34 = lVar34 + -1;
          } while (1 < lVar34);
        }
      }
    }
    else {
      pVVar14 = pSVar8->theFrhs;
      if (bVar1 == false) {
        lVar28 = 0xa30;
        lVar24 = 0xa28;
        uVar32 = (uint)((ulong)((long)(pVVar14->val).
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pVVar14->val).
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 7);
        if (0 < (int)uVar32) {
          uVar33 = (ulong)(uVar32 & 0x7fffffff);
          lVar28 = uVar33 + 1;
          lVar34 = uVar33 << 7;
          do {
            pnVar22 = (this->updPrimRhs).
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar39 = (uint *)((long)pnVar22[-1].m_backend.data._M_elems + lVar34);
            pcVar38 = &local_f88;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar38->data)._M_elems[0] = *puVar39;
              puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
            }
            local_f88.exp = *(int *)((long)(&pnVar22[-1].m_backend.data + 1) + lVar34);
            local_f88.neg = *(bool *)((long)(&pnVar22[-1].m_backend.data + 1) + lVar34 + 4U);
            local_f88._120_8_ =
                 *(undefined8 *)((long)(&pnVar22[-1].m_backend.data + 1) + lVar34 + 8U);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)
                       ((long)(pVVar14->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                       + lVar34),&local_f88);
            lVar28 = lVar28 + -1;
            lVar34 = lVar34 + -0x80;
          } while (1 < lVar28);
          lVar28 = 0xa30;
        }
      }
      else {
        lVar34 = (long)(this->updPrimRhs).super_IdxSet.num;
        lVar28 = 0xa30;
        lVar24 = 0xa28;
        if (0 < lVar34) {
          lVar34 = lVar34 + 1;
          do {
            piVar15 = (this->updPrimRhs).super_IdxSet.idx;
            pnVar22 = (this->updPrimRhs).
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar21 = piVar15[lVar34 + -2];
            pnVar37 = pnVar22 + iVar21;
            pcVar38 = &local_f88;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar38->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
              pnVar37 = (pointer)((long)pnVar37 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar49 * -8 + 4);
            }
            local_f88.exp = pnVar22[iVar21].m_backend.exp;
            local_f88.neg = pnVar22[iVar21].m_backend.neg;
            local_f88.fpclass = pnVar22[iVar21].m_backend.fpclass;
            local_f88.prec_elem = pnVar22[iVar21].m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&(pVVar14->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar15[lVar34 + -2]].m_backend,
                       &local_f88);
            lVar34 = lVar34 + -1;
          } while (1 < lVar34);
        }
      }
    }
    pSVar8 = (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thesolver;
    *(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      **)((long)&(pSVar8->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._vptr_ClassArray + lVar24) = local_cb8;
    *(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      **)((long)&(pSVar8->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._vptr_ClassArray + lVar28) = local_e60;
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::flipAndUpdate(
   int&                  nflips              /**< number of bounds that should be flipped */
)
{
   assert(nflips > 0);

   // number of bound flips that are not performed
   int skipped;

   updPrimRhs.setup();
   updPrimRhs.reDim(this->thesolver->dim());
   updPrimVec.reDim(this->thesolver->dim());
   updPrimRhs.clear();
   updPrimVec.clear();

   skipped = 0;

   for(int i = 0; i < nflips; ++i)
   {
      int idx;
      idx = breakpoints[i].idx;

      if(idx < 0)
      {
         ++skipped;
         continue;
      }

      R range;
      R upper;
      R lower;
      R objChange = 0.0;
      typename SPxBasisBase<R>::Desc::Status stat;
      typename SPxBasisBase<R>::Desc& ds = this->thesolver->basis().desc();

      range = 0;

      if(breakpoints[i].src == PVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         stat = ds.status(idx);
         upper = this->thesolver->upper(idx);
         lower = this->thesolver->lower(idx);

         switch(stat)
         {
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            ds.status(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            range = lower - upper;
            assert((*this->thesolver->theLbound)[idx] == R(-infinity));
            (*this->thesolver->theLbound)[idx] = (*this->thesolver->theUbound)[idx];
            (*this->thesolver->theUbound)[idx] = R(infinity);
            objChange = range * (*this->thesolver->theLbound)[idx];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            ds.status(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            range = upper - lower;
            assert((*this->thesolver->theUbound)[idx] == R(infinity));
            (*this->thesolver->theUbound)[idx] = (*this->thesolver->theLbound)[idx];
            (*this->thesolver->theLbound)[idx] = R(-infinity);
            objChange = range * (*this->thesolver->theUbound)[idx];
            break;

         default :
            ++skipped;
            SPX_MSG_WARNING((*this->thesolver->spxout),
                            (*this->thesolver->spxout) << "PVEC unexpected status: " << static_cast<int>(stat)
                            << " index: " << idx
                            << " val: " << this->thesolver->pVec()[idx]
                            << " upd: " << this->thesolver->pVec().delta()[idx]
                            << " lower: " << lower
                            << " upper: " << upper
                            << " bp.val: " << breakpoints[i].val
                            << std::endl;)
         }

         SPxOut::debug(this,
                       "PVEC flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} UCbound: {} LCbound: {}\n",
                       stat, idx, this->thesolver->pVec()[idx], this->thesolver->pVec().delta()[idx], lower, upper,
                       breakpoints[i].val, this->thesolver->theUCbound[idx], this->thesolver->theLCbound[idx]);
         assert(spxAbs(range) < 1e20);
         updPrimRhs.multAdd(range, this->thesolver->vector(idx));

         if(objChange != 0.0)
            this->thesolver->updateNonbasicValue(objChange);
      }
      else if(breakpoints[i].src == COPVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         stat = ds.coStatus(idx);
         upper = this->thesolver->rhs(idx);
         lower = this->thesolver->lhs(idx);

         switch(stat)
         {
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            ds.coStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            range = lower - upper;
            assert((*this->thesolver->theCoUbound)[idx] == R(infinity));
            (*this->thesolver->theCoUbound)[idx] = -(*this->thesolver->theCoLbound)[idx];
            (*this->thesolver->theCoLbound)[idx] = R(-infinity);
            objChange = range * (*this->thesolver->theCoUbound)[idx];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            ds.coStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            range = upper - lower;
            assert((*this->thesolver->theCoLbound)[idx] == R(-infinity));
            (*this->thesolver->theCoLbound)[idx] = -(*this->thesolver->theCoUbound)[idx];
            (*this->thesolver->theCoUbound)[idx] = R(infinity);
            objChange = range * (*this->thesolver->theCoLbound)[idx];
            break;

         default :
            ++skipped;
            SPX_MSG_WARNING((*this->thesolver->spxout),
                            (*this->thesolver->spxout) << "COPVEC unexpected status: " << static_cast<int>(stat)
                            << " index: " << idx
                            << " val: " << this->thesolver->coPvec()[idx]
                            << " upd: " << this->thesolver->coPvec().delta()[idx]
                            << " lower: " << lower
                            << " upper: " << upper
                            << " bp.val: " << breakpoints[i].val
                            << std::endl;)
         }

         SPxOut::debug(this,
                       "COPVEC flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} URbound: {} LRbound: {}\n",
                       stat, idx, this->thesolver->coPvec()[idx], this->thesolver->coPvec().delta()[idx], lower, upper,
                       breakpoints[i].val, this->thesolver->theURbound[idx], this->thesolver->theLRbound[idx]);
         assert(spxAbs(range) < 1e20);
         updPrimRhs.setValue(idx, updPrimRhs[idx] - range);

         if(objChange != 0.0)
            this->thesolver->updateNonbasicValue(objChange);
      }
      else if(breakpoints[i].src == FVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::ROW);
         SPxId baseId = this->thesolver->basis().baseId(idx);
         int IdNumber;

         if(baseId.isSPxRowId())
         {
            IdNumber = this->thesolver->number(SPxRowId(baseId));
            stat = ds.rowStatus(IdNumber);
            upper = this->thesolver->rhs(IdNumber);
            lower = this->thesolver->lhs(IdNumber);

            switch(stat)
            {
            case SPxBasisBase<R>::Desc::P_ON_UPPER :
               ds.rowStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               range = upper - lower;
               assert(this->thesolver->theUBbound[idx] == R(infinity));
               this->thesolver->theUBbound[idx] = -this->thesolver->theLBbound[idx];
               this->thesolver->theLBbound[idx] = R(-infinity);
               break;

            case SPxBasisBase<R>::Desc::P_ON_LOWER :
               ds.rowStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               range = lower - upper;
               assert(this->thesolver->theLBbound[idx] == R(-infinity));
               this->thesolver->theLBbound[idx] = -this->thesolver->theUBbound[idx];
               this->thesolver->theUBbound[idx] = R(infinity);
               break;

            default :
               ++skipped;
               SPX_MSG_WARNING((*this->thesolver->spxout),
                               (*this->thesolver->spxout) << "unexpected basis status: " << static_cast<int>(stat)
                               << " index: " << idx
                               << " val: " << this->thesolver->fVec()[idx]
                               << " upd: " << this->thesolver->fVec().delta()[idx]
                               << " lower: " << lower
                               << " upper: " << upper
                               << " bp.val: " << breakpoints[i].val
                               << std::endl;)
            }
         }
         else
         {
            assert(baseId.isSPxColId());
            IdNumber = this->thesolver->number(SPxColId(baseId));
            stat = ds.colStatus(IdNumber);
            upper = this->thesolver->upper(IdNumber);
            lower = this->thesolver->lower(IdNumber);

            switch(stat)
            {
            case SPxBasisBase<R>::Desc::P_ON_UPPER :
               ds.colStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               range = upper - lower;
               assert(this->thesolver->theUBbound[idx] == R(infinity));
               this->thesolver->theUBbound[idx] = -this->thesolver->theLBbound[idx];
               this->thesolver->theLBbound[idx] = R(-infinity);
               break;

            case SPxBasisBase<R>::Desc::P_ON_LOWER :
               ds.colStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               range = lower - upper;
               assert(this->thesolver->theLBbound[idx] == R(-infinity));
               this->thesolver->theLBbound[idx] = -this->thesolver->theUBbound[idx];
               this->thesolver->theUBbound[idx] = R(infinity);
               break;

            default :
               ++skipped;
               SPX_MSG_WARNING((*this->thesolver->spxout),
                               (*this->thesolver->spxout) << "FVEC unexpected status: " << static_cast<int>(stat)
                               << " index: " << idx
                               << " val: " << this->thesolver->fVec()[idx]
                               << " upd: " << this->thesolver->fVec().delta()[idx]
                               << " lower: " << lower
                               << " upper: " << upper
                               << " bp.val: " << breakpoints[i].val
                               << std::endl;)
            }
         }

         SPxOut::debug(this,
                       "basic row/col flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} \n",
                       stat, idx, this->thesolver->fVec()[idx], this->thesolver->fVec().delta()[idx], lower, upper,
                       breakpoints[i].val);
         assert(spxAbs(range) < 1e20);
         assert(updPrimRhs[idx] == 0);
         updPrimRhs.add(idx, range);
      }
   }

   nflips -= skipped;

   if(nflips > 0)
   {
      if(this->thesolver->rep() == SPxSolverBase<R>::ROW)
      {
         assert(this->m_type == SPxSolverBase<R>::ENTER);
         (*this->thesolver->theCoPrhs) -= updPrimRhs;
         this->thesolver->setup4coSolve2(&updPrimVec, &updPrimRhs);
      }
      else
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         assert(this->m_type == SPxSolverBase<R>::LEAVE);
         (*this->thesolver->theFrhs) -= updPrimRhs;
         this->thesolver->setup4solve2(&updPrimVec, &updPrimRhs);
      }
   }

   return;
}